

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_3_4::Xdr::read<Imf_3_4::CharPtrIO,char_const*>(char **in,int *v)

{
  undefined8 in_RAX;
  char b [4];
  
  b = SUB84((ulong)in_RAX >> 0x20,0);
  CharPtrIO::readChars(in,b,4);
  *v = (int)b;
  return;
}

Assistant:

void
read (T& in, signed int& v)
{
    signed char b[4];

    readSignedChars<S> (in, b, 4);

    v = (static_cast<unsigned char> (b[0]) & 0x000000ff) |
        ((static_cast<unsigned char> (b[1]) << 8) & 0x0000ff00) |
        ((static_cast<unsigned char> (b[2]) << 16) & 0x00ff0000) |
        (static_cast<unsigned char> (b[3]) << 24);
}